

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O3

void test_bson_oid_init_sequence_with_tid(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  bson_oid_t oid2;
  bson_oid_t oid;
  pthread_t apStack_90 [4];
  pthread_t apStack_70 [4];
  undefined8 uStack_50;
  undefined1 *puStack_48;
  code *pcStack_40;
  undefined1 auStack_38 [12];
  undefined1 local_2c [12];
  
  pcStack_40 = (code *)0x1353f1;
  uVar3 = bson_context_new(8);
  pcStack_40 = (code *)0x135404;
  bson_oid_init_sequence(local_2c,uVar3);
  iVar5 = 10000;
  while( true ) {
    pcStack_40 = (code *)0x135417;
    bson_oid_init_sequence(auStack_38,uVar3);
    pcStack_40 = (code *)0x135422;
    cVar1 = bson_oid_equal(local_2c);
    if (cVar1 != '\0') break;
    pcStack_40 = (code *)0x135431;
    iVar2 = bson_oid_compare(local_2c);
    if (-1 < iVar2) goto LAB_0013545c;
    pcStack_40 = (code *)0x135440;
    bson_oid_copy(auStack_38,local_2c);
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      pcStack_40 = (code *)0x13544c;
      bson_context_destroy(uVar3);
      return;
    }
  }
  pcStack_40 = (code *)0x13545c;
  test_bson_oid_init_sequence_with_tid_cold_2();
LAB_0013545c:
  pcStack_40 = test_bson_oid_init_with_threads;
  test_bson_oid_init_sequence_with_tid_cold_1();
  lVar6 = 0;
  uStack_50 = uVar3;
  puStack_48 = local_2c;
  pcStack_40 = (code *)auStack_38;
  do {
    pvVar4 = (void *)bson_context_new(8);
    *(void **)((long)apStack_90 + lVar6) = pvVar4;
    pthread_create((pthread_t *)((long)apStack_70 + lVar6),(pthread_attr_t *)0x0,oid_worker,pvVar4);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 0;
  do {
    pthread_join(apStack_70[lVar6],(void **)0x0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    bson_context_destroy(apStack_90[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pvVar4 = (void *)bson_context_new(1);
  lVar6 = 0;
  do {
    pthread_create((pthread_t *)((long)apStack_90 + lVar6),(pthread_attr_t *)0x0,oid_worker,pvVar4);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 0;
  do {
    pthread_join(apStack_90[lVar6],(void **)0x0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  bson_context_destroy(pvVar4);
  return;
}

Assistant:

static void
test_bson_oid_init_sequence_with_tid (void)
{
   bson_context_t *context;
   bson_oid_t oid;
   bson_oid_t oid2;
   int i;

   context = bson_context_new (BSON_CONTEXT_USE_TASK_ID);
   bson_oid_init_sequence (&oid, context);
   for (i = 0; i < 10000; i++) {
      bson_oid_init_sequence (&oid2, context);
      BSON_ASSERT (false == bson_oid_equal (&oid, &oid2));
      BSON_ASSERT (0 > bson_oid_compare (&oid, &oid2));
      bson_oid_copy (&oid2, &oid);
   }
   bson_context_destroy (context);
}